

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_binary.cpp
# Opt level: O1

void draw(void)

{
  GLuint GVar1;
  GLuint GVar2;
  GLint GVar3;
  GLuint vao;
  GLuint vbo;
  Vertex verts [3];
  GLfloat mat [16];
  GLuint local_c0;
  GLuint local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  GLfloat local_78 [18];
  
  (*glad_glBindFragDataLocation)(program,0,"f_color");
  (*glad_glUseProgram)(program);
  GVar1 = (*glad_glGetAttribLocation)(program,"pos");
  GVar2 = (*glad_glGetAttribLocation)(program,"color");
  GVar3 = (*glad_glGetUniformLocation)(program,"modelviewProjection");
  uStack_88 = 0;
  uStack_84 = 0x3f33333300000000;
  uStack_98 = 0x3f666666;
  uStack_90 = 0;
  local_8c = 0x3f666666;
  local_a8 = 0x3f66666600000000;
  uStack_a0 = 0xbf666666;
  local_b8 = 0xbf666666bf666666;
  uStack_b0 = 0x3f4ccccd;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[6] = 0.0;
  local_78[7] = 0.0;
  local_78[8] = 0.0;
  local_78[9] = 0.0;
  local_78[0xc] = 0.0;
  local_78[0xd] = 0.0;
  local_78[0] = 1.0;
  local_78[1] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 1.0;
  local_78[10] = 1.0;
  local_78[0xb] = 0.0;
  local_78[0xe] = 0.0;
  local_78[0xf] = 1.0;
  (*glad_glGenBuffers)(1,&local_bc);
  (*glad_glUniformMatrix4fv)(GVar3,1,'\0',local_78);
  (*glad_glClear)(0x4000);
  (*glad_glGenVertexArrays)(1,&local_c0);
  (*glad_glBindVertexArray)(local_c0);
  (*glad_glBindBuffer)(0x8892,local_bc);
  (*glad_glBufferData)(0x8892,0x3c,&local_b8,0x88e4);
  (*glad_glVertexAttribPointer)(GVar1,2,0x1406,'\0',0x14,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(GVar1);
  (*glad_glVertexAttribPointer)(GVar2,3,0x1406,'\0',0x14,(void *)0x8);
  (*glad_glEnableVertexAttribArray)(GVar2);
  (*glad_glDrawArrays)(4,0,3);
  (*glad_glDisableVertexAttribArray)(GVar1);
  (*glad_glDisableVertexAttribArray)(GVar2);
  (*glad_glUseProgram)(0);
  glfwSwapBuffers(window);
  return;
}

Assistant:

static void
draw(void)
{
    GLint u_matrix = -1;
    GLint attr_pos = 0, attr_color = 1;

    glBindFragDataLocation(program, 0, "f_color");

    glUseProgram(program);

    attr_pos = glGetAttribLocation(program, "pos");
    attr_color = glGetAttribLocation(program, "color");

    u_matrix = glGetUniformLocation(program, "modelviewProjection");
    struct Vertex {
        GLfloat pos[2];
        GLfloat color[3];
    };

    const Vertex verts[] = {
        { { -0.9f, -0.9f }, {  0.8f, 0.0f, 0.0f } },
        { {  0.9f, -0.9f }, {  0.0f, 0.9f, 0.0f } },
        { {  0.0f,  0.9f }, {  0.0f, 0.0f, 0.7f } }
    };
    GLuint vbo;

    const GLfloat mat[16] = {
        1.0f, 0.0f, 0.0f, 0.0f,
        0.0f, 1.0f, 0.0f, 0.0f, 
        0.0f, 0.0f, 1.0f, 0.0f,
        0.0f, 0.0f, 0.0f, 1.0f
    };

    glGenBuffers(1, &vbo);

    /* Set modelview/projection matrix */
    glUniformMatrix4fv(u_matrix, 1, GL_FALSE, mat);

    glClear(GL_COLOR_BUFFER_BIT);

    GLuint vao;
    glGenVertexArrays(1, &vao);
    glBindVertexArray(vao);

    glBindBuffer(GL_ARRAY_BUFFER, vbo);
    glBufferData(GL_ARRAY_BUFFER, sizeof verts, verts, GL_STATIC_DRAW);

    glVertexAttribPointer(attr_pos, ARRAY_SIZE(verts[0].pos), GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, pos));
    glEnableVertexAttribArray(attr_pos);

    glVertexAttribPointer(attr_color, ARRAY_SIZE(verts[0].color), GL_FLOAT, GL_FALSE, sizeof(Vertex), (void *)offsetof(Vertex, color));
    glEnableVertexAttribArray(attr_color);

    glDrawArrays(GL_TRIANGLES, 0, 3);

    glDisableVertexAttribArray(attr_pos);
    glDisableVertexAttribArray(attr_color);

    glUseProgram(0);

    glfwSwapBuffers(window);
}